

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatSoldier.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatSoldier::operator==
          (GED_EnhancedGroundCombatSoldier *this,GED_EnhancedGroundCombatSoldier *Value)

{
  KBOOL KVar1;
  GED_EnhancedGroundCombatSoldier *Value_local;
  GED_EnhancedGroundCombatSoldier *this_local;
  
  KVar1 = GED_BasicGroundCombatSoldier::operator!=
                    (&this->super_GED_BasicGroundCombatSoldier,
                     &Value->super_GED_BasicGroundCombatSoldier);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui8WaterStatus == Value->m_ui8WaterStatus) {
    if (this->m_ui8RestStatus == Value->m_ui8RestStatus) {
      if (this->m_ui8PriAmmun == Value->m_ui8PriAmmun) {
        if (this->m_ui8SecAmmun == Value->m_ui8SecAmmun) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GED_EnhancedGroundCombatSoldier::operator == ( const GED_EnhancedGroundCombatSoldier & Value ) const
{
    if( GED_BasicGroundCombatSoldier::operator!=( Value ) ) return false;
    if( m_ui8WaterStatus  != Value.m_ui8WaterStatus )       return false;
    if( m_ui8RestStatus   != Value.m_ui8RestStatus )        return false;
    if( m_ui8PriAmmun     != Value.m_ui8PriAmmun )          return false;
    if( m_ui8SecAmmun     != Value.m_ui8SecAmmun )          return false;
    return true;
}